

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kcpu.h
# Opt level: O1

void m68ki_stack_frame_1000(uint pc,uint sr,uint vector)

{
  uint uVar1;
  
  uVar1 = m68ki_cpu.dar[0xf] - 0x22;
  m68ki_cpu.dar[0xf] = uVar1;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(uVar1);
  }
  m68k_write_memory_16(uVar1 & m68ki_cpu.address_mask,0);
  uVar1 = m68ki_cpu.dar[0xf] - 4;
  m68ki_cpu.dar[0xf] = uVar1;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(uVar1);
  }
  m68k_write_memory_16(uVar1 & m68ki_cpu.address_mask,0);
  uVar1 = m68ki_cpu.dar[0xf] - 4;
  m68ki_cpu.dar[0xf] = uVar1;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(uVar1);
  }
  m68k_write_memory_16(uVar1 & m68ki_cpu.address_mask,0);
  uVar1 = m68ki_cpu.dar[0xf] - 6;
  m68ki_cpu.dar[0xf] = uVar1;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(uVar1);
  }
  m68k_write_memory_32(uVar1 & m68ki_cpu.address_mask,0);
  uVar1 = m68ki_cpu.dar[0xf] - 2;
  m68ki_cpu.dar[0xf] = uVar1;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(uVar1);
  }
  m68k_write_memory_16(uVar1 & m68ki_cpu.address_mask,0);
  uVar1 = m68ki_cpu.dar[0xf] - 2;
  m68ki_cpu.dar[0xf] = uVar1;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(uVar1);
  }
  m68k_write_memory_16(uVar1 & m68ki_cpu.address_mask,0x8008);
  uVar1 = m68ki_cpu.dar[0xf] - 4;
  m68ki_cpu.dar[0xf] = uVar1;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(uVar1);
  }
  m68k_write_memory_32(uVar1 & m68ki_cpu.address_mask,pc);
  uVar1 = m68ki_cpu.dar[0xf] - 2;
  m68ki_cpu.dar[0xf] = uVar1;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(uVar1);
  }
  m68k_write_memory_16(uVar1 & m68ki_cpu.address_mask,sr);
  return;
}

Assistant:

static inline void m68ki_stack_frame_1000(uint pc, uint sr, uint vector)
{
	/* VERSION
	 * NUMBER
	 * INTERNAL INFORMATION, 16 WORDS
	 */
	m68ki_fake_push_32();
	m68ki_fake_push_32();
	m68ki_fake_push_32();
	m68ki_fake_push_32();
	m68ki_fake_push_32();
	m68ki_fake_push_32();
	m68ki_fake_push_32();
	m68ki_fake_push_32();

	/* INSTRUCTION INPUT BUFFER */
	m68ki_push_16(0);

	/* UNUSED, RESERVED (not written) */
	m68ki_fake_push_16();

	/* DATA INPUT BUFFER */
	m68ki_push_16(0);

	/* UNUSED, RESERVED (not written) */
	m68ki_fake_push_16();

	/* DATA OUTPUT BUFFER */
	m68ki_push_16(0);

	/* UNUSED, RESERVED (not written) */
	m68ki_fake_push_16();

	/* FAULT ADDRESS */
	m68ki_push_32(0);

	/* SPECIAL STATUS WORD */
	m68ki_push_16(0);

	/* 1000, VECTOR OFFSET */
	m68ki_push_16(0x8000 | (vector<<2));

	/* PROGRAM COUNTER */
	m68ki_push_32(pc);

	/* STATUS REGISTER */
	m68ki_push_16(sr);
}